

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OgreStructs.cpp
# Opt level: O0

void __thiscall Assimp::Ogre::Skeleton::~Skeleton(Skeleton *this)

{
  Skeleton *this_local;
  
  Reset(this);
  std::vector<Assimp::Ogre::Animation_*,_std::allocator<Assimp::Ogre::Animation_*>_>::~vector
            (&this->animations);
  std::vector<Assimp::Ogre::Bone_*,_std::allocator<Assimp::Ogre::Bone_*>_>::~vector(&this->bones);
  return;
}

Assistant:

Skeleton::~Skeleton()
{
    Reset();
}